

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons4.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int *piVar2;
  int local_99c;
  int local_998;
  int val_mutex;
  int val_stored;
  int val_empty;
  int total_c;
  int total_p;
  int count_c [100];
  int count_p [100];
  uint local_65c;
  int i;
  pthread_t tid_consumer [100];
  pthread_t tid_producer [100];
  char **argv_local;
  int argc_local;
  
  if (argc != 4) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x20);
    err_quit("usage: %s [#items] [#producers] [#consumers]",*argv);
  }
  nitems = atoi(argv[1]);
  nproducers = atoi(argv[2]);
  nconsumers = atoi(argv[3]);
  shared.mutex = (sem_t *)sem_open("/sem_mutex",0xc0,(ulong)_FILE_MODE,1);
  shared.nempty = (sem_t *)sem_open("/sem_nempty",0xc0,(ulong)_FILE_MODE,10);
  shared.nstored = (sem_t *)sem_open("/sem_nstored",0xc0,(ulong)_FILE_MODE,0);
  if (shared.mutex == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x2a);
    piVar2 = __errno_location();
    err_quit("Failed to create semaphore mutex: %d",*piVar2);
  }
  if (shared.nempty == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x2b);
    piVar2 = __errno_location();
    err_quit("Failed to create semaphore nempty: %d",*piVar2);
  }
  if (shared.nstored == (sem_t *)0x0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x2c);
    piVar2 = __errno_location();
    err_quit("Failed to create semaphore nstored: %d",*piVar2);
  }
  shared.nput = 0;
  shared.nputval = 0;
  shared.nget = 0;
  shared.ngetval = 0;
  for (local_65c = 0; (int)local_65c < nproducers; local_65c = local_65c + 1) {
    iVar1 = pthread_create(tid_consumer + (long)(int)local_65c + 99,(pthread_attr_t *)0x0,producer,
                           count_c + (long)(int)local_65c + 0x62);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
              ,0x35);
      err_quit("Failed to create producer thread");
    }
  }
  for (local_65c = 0; (int)local_65c < nconsumers; local_65c = local_65c + 1) {
    iVar1 = pthread_create((pthread_t *)(&stack0xfffffffffffff9a8 + (long)(int)local_65c * 8),
                           (pthread_attr_t *)0x0,consumer,&total_c + (int)local_65c);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
              ,0x39);
      err_quit("Failed to create consumer thread");
    }
  }
  val_empty = 0;
  val_stored = 0;
  for (local_65c = 0; (int)local_65c < nproducers; local_65c = local_65c + 1) {
    iVar1 = pthread_join(tid_consumer[(long)(int)local_65c + 99],(void **)0x0);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
              ,0x3f);
      err_quit("Failed to join producer thread: %ld",tid_consumer[(long)(int)local_65c + 99]);
    }
    val_empty = count_c[(long)(int)local_65c + 0x62] + val_empty;
    printf("count_p[%d] = %d\n",(ulong)local_65c,(ulong)(uint)count_c[(long)(int)local_65c + 0x62]);
  }
  iVar1 = sem_post((sem_t *)shared.nstored);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x43);
    err_quit("Failed to post to nstored");
  }
  for (local_65c = 0; (int)local_65c < nconsumers; local_65c = local_65c + 1) {
    iVar1 = pthread_join(*(pthread_t *)(&stack0xfffffffffffff9a8 + (long)(int)local_65c * 8),
                         (void **)0x0);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
              ,0x46);
      err_quit("Failed to join consumer thread: %ld",
               *(undefined8 *)(&stack0xfffffffffffff9a8 + (long)(int)local_65c * 8));
    }
    val_stored = (&total_c)[(int)local_65c] + val_stored;
    printf("count_c[%d] = %d\n",(ulong)local_65c,(ulong)(uint)(&total_c)[(int)local_65c]);
  }
  iVar1 = sem_wait((sem_t *)shared.nstored);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x4a);
    err_quit("Failed to wait for nstored");
  }
  val_mutex = 0;
  local_998 = 0;
  local_99c = 0;
  iVar1 = sem_getvalue((sem_t *)shared.nstored,&local_998);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x4e);
    err_sys("Failed to get value of nstored");
  }
  iVar1 = sem_getvalue((sem_t *)shared.nempty,&val_mutex);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x4f);
    err_sys("Failed to get value of nempty");
  }
  iVar1 = sem_getvalue((sem_t *)shared.mutex,&local_99c);
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x50);
    err_sys("Failed to get value of stored");
  }
  if (((val_mutex != 10) || (local_998 != 0)) || (local_99c != 1)) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x53);
    err_sys("logic error: empty = %d, stored = %d, mutex = %d",val_mutex,local_998,local_99c);
  }
  iVar1 = sem_unlink("/sem_mutex");
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x56);
    err_quit("Failed to unlink semaphore mutex");
  }
  iVar1 = sem_unlink("/sem_nempty");
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x57);
    err_quit("Failed to unlink semaphore nempty");
  }
  iVar1 = sem_unlink("/sem_nstored");
  if (iVar1 != 0) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x58);
    err_quit("Failed to unlink semaphore nstored");
  }
  if (val_empty != nitems) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x5a);
    err_quit("total_p = %d, nitems = %d",val_empty,nitems);
  }
  if (val_stored != nitems) {
    fprintf(_stderr,"[%s:%d]",
            "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons4.c"
            ,0x5b);
    err_quit("total_c = %d, nitems = %d",val_stored,nitems);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  pthread_t tid_producer[MAXTHREADS], tid_consumer[MAXTHREADS];
  int i, count_p[MAXTHREADS], count_c[MAXTHREADS];

  ASSERT_ERR_QUIT(argc == 4, "usage: %s [#items] [#producers] [#consumers]", argv[0]);

  nitems = atoi(argv[1]);
  nproducers = atoi(argv[2]);
  nconsumers = atoi(argv[3]);

  shared.mutex = sem_open(SEM_MUTEX, O_CREAT | O_EXCL, FILE_MODE, 1);
  shared.nempty = sem_open(SEM_NEMPTY, O_CREAT | O_EXCL, FILE_MODE, NBUFF);
  shared.nstored = sem_open(SEM_NSTORED, O_CREAT | O_EXCL, FILE_MODE, 0);

  ASSERT_ERR_QUIT(shared.mutex != SEM_FAILED, "Failed to create semaphore mutex: %d", errno);
  ASSERT_ERR_QUIT(shared.nempty != SEM_FAILED, "Failed to create semaphore nempty: %d", errno);
  ASSERT_ERR_QUIT(shared.nstored != SEM_FAILED, "Failed to create semaphore nstored: %d", errno);

  shared.nput = 0;
  shared.nputval = 0;  
  shared.nget = 0;
  shared.ngetval = 0;

  for (i = 0; i < nproducers; ++i) {
    ASSERT_ERR_QUIT(pthread_create(&tid_producer[i], NULL, &producer, &count_p[i]) == 0, 
      "Failed to create producer thread");
  }
  for (i = 0; i < nconsumers; ++i) {
    ASSERT_ERR_QUIT(pthread_create(&tid_consumer[i], NULL, &consumer, &count_c[i]) == 0,
      "Failed to create consumer thread");
  }
  int total_p = 0, total_c = 0;

  for (i = 0; i < nproducers; ++i) {
    ASSERT_ERR_QUIT(pthread_join(tid_producer[i], NULL) == 0, 
      "Failed to join producer thread: %ld", tid_producer[i]);
    total_p += count_p[i];
    printf("count_p[%d] = %d\n", i, count_p[i]);
  }
  ASSERT_ERR_QUIT(sem_post(shared.nstored) == 0, "Failed to post to nstored");
  for (i = 0; i < nconsumers; ++i) {
    ASSERT_ERR_QUIT(pthread_join(tid_consumer[i], NULL) == 0, 
      "Failed to join consumer thread: %ld", tid_consumer[i]);
    total_c += count_c[i];
    printf("count_c[%d] = %d\n", i, count_c[i]);
  }
  ASSERT_ERR_QUIT(sem_wait(shared.nstored) == 0, "Failed to wait for nstored");

#if __linux__
  int val_empty = 0, val_stored = 0, val_mutex = 0;
  ASSERT_ERR_SYS(sem_getvalue(shared.nstored, &val_stored) == 0, "Failed to get value of nstored");
  ASSERT_ERR_SYS(sem_getvalue(shared.nempty, &val_empty) == 0, "Failed to get value of nempty");
  ASSERT_ERR_SYS(sem_getvalue(shared.mutex, &val_mutex) == 0, "Failed to get value of stored");

  ASSERT_ERR_SYS(val_empty == NBUFF && val_stored == 0 && val_mutex == 1, 
    "logic error: empty = %d, stored = %d, mutex = %d", val_empty, val_stored, val_mutex);
#endif

  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_MUTEX), "Failed to unlink semaphore mutex");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NEMPTY), "Failed to unlink semaphore nempty");
  ASSERT_ERR_QUIT(0 == sem_unlink(SEM_NSTORED), "Failed to unlink semaphore nstored");

  ASSERT_ERR_QUIT(total_p == nitems, "total_p = %d, nitems = %d", total_p, nitems);
  ASSERT_ERR_QUIT(total_c == nitems, "total_c = %d, nitems = %d", total_c, nitems);
  return 0;
}